

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
bas::Vector<bool,4ul,bas::RawAllocator>::init_copy_from_other_vector<4ul>
          (Vector<bool,4ul,bas::RawAllocator> *this,Vector<bool,_4UL,_bas::RawAllocator> *other)

{
  size_t size;
  Vector<bool,4ul,bas::RawAllocator> *__dest;
  size_t sVar1;
  size_t __n;
  Vector<bool,4ul,bas::RawAllocator> *pVVar2;
  
  size = Vector<bool,_4UL,_bas::RawAllocator>::size(other);
  if (size < 5) {
    __dest = this + 0x19;
    sVar1 = 4;
  }
  else {
    __dest = (Vector<bool,4ul,bas::RawAllocator> *)aligned_malloc(size,1);
    sVar1 = size;
  }
  *(Vector<bool,4ul,bas::RawAllocator> **)this = __dest;
  pVVar2 = __dest + size;
  *(Vector<bool,4ul,bas::RawAllocator> **)(this + 8) = pVVar2;
  *(Vector<bool,4ul,bas::RawAllocator> **)(this + 0x10) = __dest + sVar1;
  __n = (long)other->m_end - (long)other->m_begin;
  if (__n != 0) {
    memmove(__dest,other->m_begin,__n);
    __dest = *(Vector<bool,4ul,bas::RawAllocator> **)this;
    pVVar2 = *(Vector<bool,4ul,bas::RawAllocator> **)(this + 8);
  }
  *(long *)(this + 0x20) = (long)pVVar2 - (long)__dest;
  return;
}

Assistant:

void init_copy_from_other_vector(const Vector<T, OtherN, Allocator> &other)
    {
        m_allocator = other.m_allocator;

        size_t size = other.size();
        size_t capacity = size;

        if (size <= N) {
            m_begin = this->small_buffer();
            capacity = N;
        }
        else {
            m_begin = (T *)m_allocator.allocate(sizeof(T) * size,
                                                std::alignment_of<T>::value);
            capacity = size;
        }

        m_end = m_begin + size;
        m_capacity_end = m_begin + capacity;

        uninitialized_copy(other.begin(), other.end(), m_begin);
        UPDATE_VECTOR_SIZE(this);
    }